

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_utils.h
# Opt level: O0

void __thiscall
HandleInfo<XrTriangleMeshFB_T_*>::removeHandlesForInstance
          (HandleInfo<XrTriangleMeshFB_T_*> *this,GenValidUsageXrInstanceInfo *search_value)

{
  anon_class_8_1_3c46da18 local_30;
  undefined1 local_28 [8];
  UniqueLock lock;
  GenValidUsageXrInstanceInfo *search_value_local;
  HandleInfo<XrTriangleMeshFB_T_*> *this_local;
  
  lock._8_8_ = search_value;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_28,
             &(this->super_HandleInfoBase<XrTriangleMeshFB_T_*,_GenValidUsageXrHandleInfo>).
              dispatch_mutex_);
  local_30.search_value = (GenValidUsageXrInstanceInfo *)lock._8_8_;
  map_erase_if<std::unordered_map<XrTriangleMeshFB_T*,std::unique_ptr<GenValidUsageXrHandleInfo,std::default_delete<GenValidUsageXrHandleInfo>>,std::hash<XrTriangleMeshFB_T*>,std::equal_to<XrTriangleMeshFB_T*>,std::allocator<std::pair<XrTriangleMeshFB_T*const,std::unique_ptr<GenValidUsageXrHandleInfo,std::default_delete<GenValidUsageXrHandleInfo>>>>>,HandleInfo<XrTriangleMeshFB_T*>::removeHandlesForInstance(GenValidUsageXrInstanceInfo*)::_lambda(std::pair<XrTriangleMeshFB_T*const,std::unique_ptr<GenValidUsageXrHandleInfo,std::default_delete<GenValidUsageXrHandleInfo>>>const&)_1_>
            ((unordered_map<XrTriangleMeshFB_T_*,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>,_std::hash<XrTriangleMeshFB_T_*>,_std::equal_to<XrTriangleMeshFB_T_*>,_std::allocator<std::pair<XrTriangleMeshFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>_>
              *)this,&local_30);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return;
}

Assistant:

inline void HandleInfo<HandleType>::removeHandlesForInstance(GenValidUsageXrInstanceInfo *search_value) {
    typedef typename base_t::value_t value_t;
    UniqueLock lock(this->dispatch_mutex_);
    map_erase_if(this->info_map_, [=](value_t const &data) { return data.second && data.second->instance_info == search_value; });
}